

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_req_set_reader(Curl_easy *data,Curl_HttpReq httpreq,char **tep)

{
  char *pcVar1;
  undefined1 *puVar2;
  long lVar3;
  curl_trc_feat *pcVar4;
  _Bool _Var5;
  CURLcode CVar6;
  CURLcode CVar7;
  uint uVar8;
  char *pcVar9;
  char *pcVar10;
  curl_off_t cVar11;
  curl_mimepart *pcVar12;
  size_t blen;
  bool bVar13;
  
  if (((data->req).field_0xdb & 4) != 0) goto LAB_001355cb;
  if (3 < httpreq - HTTPREQ_POST) {
    (data->state).infilesize = 0;
    goto LAB_001355cb;
  }
  blen = (data->state).infilesize;
  switch(httpreq) {
  case HTTPREQ_POST:
    if (blen != 0) {
      pcVar10 = (char *)(data->set).postfields;
      if (pcVar10 == (char *)0x0) {
        pcVar10 = Curl_checkheaders(data,"Transfer-Encoding",0x11);
        if ((pcVar10 != (char *)0x0) &&
           (_Var5 = Curl_compareheader(pcVar10,"Transfer-Encoding:",0x12,"chunked",7), _Var5)) {
          blen = 0xffffffffffffffff;
        }
        goto LAB_0013554e;
      }
      if (0 < (long)blen) {
        CVar6 = Curl_creader_set_buf(data,pcVar10,blen);
        goto LAB_001355d5;
      }
    }
    break;
  case HTTPREQ_POST_FORM:
    if ((data->state).formp == (curl_mimepart *)0x0) {
      pcVar12 = (curl_mimepart *)(*Curl_ccalloc)(1,0x1b8);
      (data->state).formp = pcVar12;
      if (pcVar12 == (curl_mimepart *)0x0) {
        CVar6 = CURLE_OUT_OF_MEMORY;
        goto LAB_001355d5;
      }
      Curl_mime_cleanpart(pcVar12);
      CVar6 = Curl_getformdata(data,(data->state).formp,(data->set).httppost,
                               (data->state).fread_func);
      if (CVar6 != CURLE_OK) {
        (*Curl_cfree)((data->state).formp);
        (data->state).formp = (curl_mimepart *)0x0;
        goto LAB_001355d5;
      }
      pcVar12 = (data->state).formp;
      goto LAB_00135540;
    }
    goto LAB_00135569;
  case HTTPREQ_POST_MIME:
    pcVar12 = &(data->set).mimepost;
LAB_00135540:
    (data->state).mimepost = pcVar12;
LAB_00135569:
    if ((httpreq & ~HTTPREQ_POST) == HTTPREQ_POST_FORM) {
      if ((data->state).mimepost == (curl_mimepart *)0x0) {
        CVar6 = Curl_creader_set_null(data);
      }
      else {
        pcVar10 = Curl_checkheaders(data,"Content-Type",0xc);
        pcVar12 = (data->state).mimepost;
        pcVar12->flags = pcVar12->flags | 2;
        if (pcVar10 == (char *)0x0) {
          pcVar10 = (char *)0x0;
          if (pcVar12->kind == MIMEKIND_MULTIPART) {
            pcVar10 = "multipart/form-data";
          }
        }
        else {
          pcVar9 = pcVar10 + 0xc;
          do {
            pcVar10 = pcVar9 + 1;
            pcVar1 = pcVar9 + 1;
            pcVar9 = pcVar10;
          } while (*pcVar1 == ' ');
        }
        bVar13 = false;
        curl_mime_headers(pcVar12,(data->set).headers,0);
        CVar6 = Curl_mime_prepare_headers
                          (data,(data->state).mimepost,pcVar10,(char *)0x0,MIMESTRATEGY_FORM);
        if (CVar6 == CURLE_OK) {
          curl_mime_headers((data->state).mimepost,(curl_slist *)0x0,0);
          CVar6 = Curl_creader_set_mime(data,(data->state).mimepost);
          bVar13 = CVar6 == CURLE_OK;
        }
        if (!bVar13) goto LAB_001355d5;
      }
      cVar11 = Curl_creader_total_length(data);
      (data->state).infilesize = cVar11;
      goto LAB_001355d5;
    }
    break;
  case HTTPREQ_PUT:
    if (blen != 0) {
LAB_0013554e:
      CVar6 = Curl_creader_set_fread(data,blen);
      goto LAB_001355d5;
    }
  }
LAB_001355cb:
  CVar6 = Curl_creader_set_null(data);
LAB_001355d5:
  if (CVar6 == CURLE_OK) {
    CVar6 = CURLE_OK;
    if (((httpreq == HTTPREQ_PUT) || (httpreq == HTTPREQ_POST)) &&
       (lVar3 = (data->state).resume_from, lVar3 != 0)) {
      if (lVar3 < 0) {
        (data->state).resume_from = 0;
      }
      lVar3 = (data->state).resume_from;
      if (((lVar3 != 0) && (CVar6 = CURLE_OK, ((data->req).field_0xdb & 4) == 0)) &&
         (CVar7 = Curl_creader_resume_from(data,lVar3), CVar7 != CURLE_OK)) {
        Curl_failf(data,"Unable to resume from offset %ld",(data->state).resume_from);
        CVar6 = CVar7;
      }
    }
    if (CVar6 == CURLE_OK) {
      pcVar10 = Curl_checkheaders(data,"Transfer-Encoding",0x11);
      if (pcVar10 == (char *)0x0) {
        cVar11 = Curl_creader_total_length(data);
        if (cVar11 < 0) {
          if ((((data->state).httpversion == '\n') || (data->conn->httpversion == '\n')) ||
             ((data->state).httpwant == '\x01')) {
            Curl_failf(data,"Chunky upload is not supported by HTTP 1.0");
            return CURLE_UPLOAD_FAILED;
          }
          uVar8 = *(uint *)&(data->req).field_0xd9 & 0xffff7fff |
                  (uint)(data->conn->httpversion < 0x14) << 0xf;
        }
        else {
          uVar8 = *(uint *)&(data->req).field_0xd9 & 0xffff7fff;
        }
        *(uint *)&(data->req).field_0xd9 = uVar8;
        CVar6 = CURLE_OK;
        if ((short)uVar8 < 0) {
          *tep = "Transfer-Encoding: chunked\r\n";
        }
      }
      else {
        _Var5 = Curl_compareheader(pcVar10,"Transfer-Encoding:",0x12,"chunked",7);
        *(uint *)&(data->req).field_0xd9 =
             *(uint *)&(data->req).field_0xd9 & 0xffff7fff | (uint)_Var5 << 0xf;
        CVar7 = CURLE_OK;
        CVar6 = CURLE_OK;
        if ((((_Var5) && ((data->state).httpversion != '\n')) &&
            (CVar6 = CVar7, data->conn->httpversion != '\n')) &&
           (((data->state).httpwant != '\x01' && (0x13 < data->conn->httpversion)))) {
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
             ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
              (0 < pcVar4->log_level)))) {
            Curl_infof(data,
                       "suppressing chunked transfer encoding on connection using HTTP version 2 or higher"
                      );
          }
          puVar2 = &(data->req).field_0xda;
          *puVar2 = *puVar2 & 0x7f;
        }
      }
    }
  }
  return CVar6;
}

Assistant:

CURLcode Curl_http_req_set_reader(struct Curl_easy *data,
                                  Curl_HttpReq httpreq,
                                  const char **tep)
{
  CURLcode result = CURLE_OK;
  const char *ptr;

  result = set_reader(data, httpreq);
  if(result)
    return result;

  result = http_resume(data, httpreq);
  if(result)
    return result;

  ptr = Curl_checkheaders(data, STRCONST("Transfer-Encoding"));
  if(ptr) {
    /* Some kind of TE is requested, check if 'chunked' is chosen */
    data->req.upload_chunky =
      Curl_compareheader(ptr,
                         STRCONST("Transfer-Encoding:"), STRCONST("chunked"));
    if(data->req.upload_chunky &&
       Curl_use_http_1_1plus(data, data->conn) &&
       (data->conn->httpversion >= 20)) {
       infof(data, "suppressing chunked transfer encoding on connection "
             "using HTTP version 2 or higher");
       data->req.upload_chunky = FALSE;
    }
  }
  else {
    curl_off_t req_clen = Curl_creader_total_length(data);

    if(req_clen < 0) {
      /* indeterminate request content length */
      if(Curl_use_http_1_1plus(data, data->conn)) {
        /* On HTTP/1.1, enable chunked, on HTTP/2 and later we do not
         * need it */
        data->req.upload_chunky = (data->conn->httpversion < 20);
      }
      else {
        failf(data, "Chunky upload is not supported by HTTP 1.0");
        return CURLE_UPLOAD_FAILED;
      }
    }
    else {
      /* else, no chunky upload */
      data->req.upload_chunky = FALSE;
    }

    if(data->req.upload_chunky)
      *tep = "Transfer-Encoding: chunked\r\n";
  }
  return result;
}